

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_trng::bernoulli_dist<int>_&,_const_trng::bernoulli_dist<int>_&> * __thiscall
Catch::ExprLhs<trng::bernoulli_dist<int>const&>::operator==
          (BinaryExpr<const_trng::bernoulli_dist<int>_&,_const_trng::bernoulli_dist<int>_&>
           *__return_storage_ptr__,ExprLhs<trng::bernoulli_dist<int>const&> *this,
          bernoulli_dist<int> *rhs)

{
  bernoulli_dist<int> *pbVar1;
  bool bVar2;
  StringRef local_38;
  
  bVar2 = trng::operator==(*(param_type **)this,&rhs->P);
  pbVar1 = *(bernoulli_dist<int> **)this;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_002ea3b8;
  __return_storage_ptr__->m_lhs = pbVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }